

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O1

bool __thiscall DOptionMenu::Responder(DOptionMenu *this,event_t *ev)

{
  BYTE BVar1;
  short sVar2;
  short sVar3;
  FOptionMenuDescriptor *pFVar4;
  bool bVar5;
  int iVar6;
  _func_int **pp_Var7;
  int iVar8;
  undefined8 uVar9;
  
  if (ev->type == '\x04') {
    if (ev->subtype == '\x11') {
      if (this->CanScrollDown == true) {
        iVar6 = this->VisBottom;
        pFVar4 = this->mDesc;
        if (iVar6 < (int)((pFVar4->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count
                         - 2)) {
          pFVar4->mScrollPos = pFVar4->mScrollPos + 2;
          iVar6 = iVar6 + 2;
        }
        else {
          pFVar4->mScrollPos = pFVar4->mScrollPos + 1;
          iVar6 = iVar6 + 1;
        }
        this->VisBottom = iVar6;
      }
      return true;
    }
    if (ev->subtype == '\x10') {
      iVar6 = this->mDesc->mScrollPos;
      iVar8 = 2;
      if (iVar6 < 2) {
        iVar8 = iVar6;
      }
      this->mDesc->mScrollPos = iVar6 - iVar8;
      return true;
    }
  }
  if (ev->type != '\x04') {
    return false;
  }
  BVar1 = ev->subtype;
  if (BVar1 == '\x06') {
    BackbuttonTime = 0x8c;
    if (((this->super_DMenu).super_DObject.field_0x24 == '\0') && (m_use_mouse.Value != 1)) {
      BackbuttonTime = 0x8c;
      return false;
    }
    bVar5 = DMenu::MouseEventBack(&this->super_DMenu,1,(int)ev->data1,(int)ev->data2);
    if (bVar5) {
      ev->data2 = -1;
    }
    sVar2 = ev->data1;
    sVar3 = ev->data2;
    pp_Var7 = (this->super_DMenu).super_DObject._vptr_DObject;
    uVar9 = 1;
  }
  else {
    if (BVar1 != '\b') {
      if (BVar1 != '\a') {
        return false;
      }
      bVar5 = DMenu::MouseEventBack(&this->super_DMenu,0,(int)ev->data1,(int)ev->data2);
      if (bVar5) {
        ev->data2 = -1;
      }
      iVar6 = (*(this->super_DMenu).super_DObject._vptr_DObject[0xe])
                        (this,0,(ulong)(uint)(int)ev->data1,(ulong)(uint)(int)ev->data2);
      if ((byte)(bVar5 | (byte)iVar6) != 1) {
        return false;
      }
      if ((this->super_DMenu).super_DObject.field_0x24 != '\0') {
        return false;
      }
      (this->super_DMenu).super_DObject.field_0x24 = 1;
      I_SetMouseCapture();
      return false;
    }
    if ((this->super_DMenu).super_DObject.field_0x24 != '\x01') {
      return false;
    }
    (this->super_DMenu).super_DObject.field_0x24 = 0;
    I_ReleaseMouseCapture();
    bVar5 = DMenu::MouseEventBack(&this->super_DMenu,2,(int)ev->data1,(int)ev->data2);
    if (bVar5) {
      ev->data2 = -1;
    }
    sVar2 = ev->data1;
    sVar3 = ev->data2;
    pp_Var7 = (this->super_DMenu).super_DObject._vptr_DObject;
    uVar9 = 2;
  }
  (*pp_Var7[0xe])(this,uVar9,(ulong)(uint)(int)sVar2,(ulong)(uint)(int)sVar3);
  return false;
}

Assistant:

bool DOptionMenu::Responder (event_t *ev)
{
	if (ev->type == EV_GUI_Event)
	{
		if (ev->subtype == EV_GUI_WheelUp)
		{
			int scrollamt = MIN(2, mDesc->mScrollPos);
			mDesc->mScrollPos -= scrollamt;
			return true;
		}
		else if (ev->subtype == EV_GUI_WheelDown)
		{
			if (CanScrollDown)
			{
				if (VisBottom < (int)(mDesc->mItems.Size()-2))
				{
					mDesc->mScrollPos += 2;
					VisBottom += 2;
				}
				else
				{
					mDesc->mScrollPos++;
					VisBottom++;
				}
			}
			return true;
		}
	}
	return Super::Responder(ev);
}